

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O2

void __thiscall
TEST_MemoryLeakDetectorTest_TwoLeaksUsingOperatorNew_TestShell::
TEST_MemoryLeakDetectorTest_TwoLeaksUsingOperatorNew_TestShell
          (TEST_MemoryLeakDetectorTest_TwoLeaksUsingOperatorNew_TestShell *this)

{
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell = (_func_int **)&PTR__ExecFunctionTestShell_0035fd78;
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, TwoLeaksUsingOperatorNew)
{
    char* mem = detector->allocMemory(defaultNewAllocator(), 4);
    char* mem2 = detector->allocMemory(defaultNewAllocator(), 8);
    detector->stopChecking();
    SimpleString output = detector->report(mem_leak_period_checking);
    LONGS_EQUAL(2, detector->totalMemoryLeaks(mem_leak_period_checking));
    CHECK(output.contains("size: 8"));
    CHECK(output.contains("size: 4"));
    PlatformSpecificFree(mem);
    PlatformSpecificFree(mem2);
}